

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpf_common_sse2.h
# Opt level: O0

void transpose_16x8(uchar *in0,uchar *in1,int in_p,uchar *out,int out_p)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined2 uVar9;
  undefined4 uVar10;
  undefined6 uVar11;
  undefined2 uVar12;
  undefined4 uVar13;
  undefined6 uVar14;
  undefined8 *puVar15;
  undefined8 *in_RCX;
  int in_EDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  __m128i x7;
  __m128i x6;
  __m128i x5;
  __m128i x4;
  __m128i x3;
  __m128i x2;
  __m128i x1;
  __m128i x0;
  undefined8 local_838;
  undefined8 local_828;
  undefined4 local_818;
  undefined2 uStack_814;
  undefined2 uStack_812;
  undefined4 uStack_810;
  undefined2 uStack_80c;
  undefined2 uStack_80a;
  undefined4 local_808;
  undefined4 uStack_800;
  undefined2 uStack_7f0;
  undefined1 uStack_7ee;
  undefined1 uStack_7ed;
  undefined1 uStack_7ec;
  undefined1 uStack_7eb;
  undefined1 uStack_7ea;
  undefined1 uStack_7e9;
  undefined2 uStack_7e0;
  undefined1 uStack_7de;
  undefined1 uStack_7dd;
  undefined1 uStack_7dc;
  undefined1 uStack_7db;
  undefined1 uStack_7da;
  undefined1 uStack_7d9;
  undefined2 uStack_7d0;
  undefined2 uStack_7c0;
  undefined8 local_7b8;
  undefined8 local_7a8;
  undefined4 local_798;
  undefined4 uStack_790;
  undefined4 local_788;
  undefined4 uStack_780;
  undefined2 uStack_770;
  undefined2 uStack_760;
  undefined2 uStack_750;
  undefined2 uStack_740;
  undefined1 local_488;
  undefined1 uStack_487;
  undefined1 uStack_486;
  undefined1 uStack_485;
  undefined1 uStack_484;
  undefined1 uStack_483;
  undefined1 uStack_482;
  undefined1 uStack_481;
  undefined1 uStack_477;
  undefined1 uStack_476;
  undefined1 uStack_475;
  undefined1 uStack_474;
  undefined1 uStack_473;
  undefined1 uStack_472;
  undefined1 uStack_471;
  undefined1 local_468;
  undefined1 uStack_467;
  undefined1 uStack_466;
  undefined1 uStack_465;
  undefined1 uStack_464;
  undefined1 uStack_463;
  undefined1 uStack_462;
  undefined1 uStack_461;
  undefined1 uStack_457;
  undefined1 uStack_456;
  undefined1 uStack_455;
  undefined1 uStack_454;
  undefined1 uStack_453;
  undefined1 uStack_452;
  undefined1 uStack_451;
  undefined1 local_448;
  undefined1 uStack_446;
  undefined1 uStack_444;
  undefined1 uStack_442;
  undefined1 uStack_436;
  undefined1 uStack_434;
  undefined1 uStack_432;
  undefined1 local_428;
  undefined1 uStack_426;
  undefined1 uStack_424;
  undefined1 uStack_422;
  undefined1 uStack_416;
  undefined1 uStack_414;
  undefined1 uStack_412;
  undefined1 local_408;
  undefined1 uStack_406;
  undefined1 uStack_404;
  undefined1 uStack_402;
  undefined1 uStack_3f6;
  undefined1 uStack_3f4;
  undefined1 uStack_3f2;
  undefined1 local_3e8;
  undefined1 uStack_3e6;
  undefined1 uStack_3e4;
  undefined1 uStack_3e2;
  undefined1 uStack_3d6;
  undefined1 uStack_3d4;
  undefined1 uStack_3d2;
  undefined1 local_3c8;
  undefined1 uStack_3c6;
  undefined1 uStack_3c4;
  undefined1 uStack_3c2;
  undefined1 uStack_3b6;
  undefined1 uStack_3b4;
  undefined1 uStack_3b2;
  undefined1 local_3a8;
  undefined1 uStack_3a6;
  undefined1 uStack_3a4;
  undefined1 uStack_3a2;
  undefined1 uStack_396;
  undefined1 uStack_394;
  undefined1 uStack_392;
  undefined8 local_308;
  undefined8 local_2c8;
  undefined8 local_288;
  undefined8 local_248;
  undefined2 uStack_206;
  undefined2 uStack_204;
  undefined2 uStack_202;
  undefined2 uStack_1f6;
  undefined2 uStack_1f4;
  undefined2 uStack_1f2;
  undefined4 uStack_180;
  undefined4 uStack_160;
  undefined4 uStack_140;
  undefined4 uStack_120;
  __m128i x15;
  __m128i x14;
  __m128i x13;
  __m128i x12;
  __m128i x11;
  __m128i x10;
  __m128i x9;
  __m128i x8;
  
  uVar1 = *in_RDI;
  uVar2 = *(undefined8 *)((long)in_RDI + (long)in_EDX);
  uStack_396 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_394 = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_392 = (undefined1)((ulong)uVar1 >> 0x30);
  local_3a8 = (undefined1)uVar2;
  uStack_3a6 = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_3a4 = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_3a2 = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_740 = CONCAT11(uStack_3a4,uStack_394);
  uVar2 = *(undefined8 *)((long)in_RDI + (long)(in_EDX * 2));
  uVar3 = *(undefined8 *)((long)in_RDI + (long)(in_EDX * 3));
  uStack_3b6 = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_3b4 = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_3b2 = (undefined1)((ulong)uVar2 >> 0x30);
  local_3c8 = (undefined1)uVar3;
  uStack_3c6 = (undefined1)((ulong)uVar3 >> 0x10);
  uStack_3c4 = (undefined1)((ulong)uVar3 >> 0x20);
  uStack_3c2 = (undefined1)((ulong)uVar3 >> 0x30);
  uStack_750 = CONCAT11(uStack_3c4,uStack_3b4);
  uVar3 = *(undefined8 *)((long)in_RDI + (long)(in_EDX << 2));
  uVar4 = *(undefined8 *)((long)in_RDI + (long)(in_EDX * 5));
  uStack_3d6 = (undefined1)((ulong)uVar3 >> 0x10);
  uStack_3d4 = (undefined1)((ulong)uVar3 >> 0x20);
  uStack_3d2 = (undefined1)((ulong)uVar3 >> 0x30);
  local_3e8 = (undefined1)uVar4;
  uStack_3e6 = (undefined1)((ulong)uVar4 >> 0x10);
  uStack_3e4 = (undefined1)((ulong)uVar4 >> 0x20);
  uStack_3e2 = (undefined1)((ulong)uVar4 >> 0x30);
  uStack_760 = CONCAT11(uStack_3e4,uStack_3d4);
  uVar4 = *(undefined8 *)((long)in_RDI + (long)(in_EDX * 6));
  uVar5 = *(undefined8 *)((long)in_RDI + (long)(in_EDX * 7));
  uStack_3f6 = (undefined1)((ulong)uVar4 >> 0x10);
  uStack_3f4 = (undefined1)((ulong)uVar4 >> 0x20);
  uStack_3f2 = (undefined1)((ulong)uVar4 >> 0x30);
  local_408 = (undefined1)uVar5;
  uStack_406 = (undefined1)((ulong)uVar5 >> 0x10);
  uStack_404 = (undefined1)((ulong)uVar5 >> 0x20);
  uStack_402 = (undefined1)((ulong)uVar5 >> 0x30);
  uStack_770 = CONCAT11(uStack_404,uStack_3f4);
  uStack_780 = CONCAT22(CONCAT11(uStack_3c6,uStack_3b6),CONCAT11(uStack_3a6,uStack_396));
  uVar5 = *in_RSI;
  uVar6 = *(undefined8 *)((long)in_RSI + (long)in_EDX);
  uStack_416 = (undefined1)((ulong)uVar5 >> 0x10);
  uStack_414 = (undefined1)((ulong)uVar5 >> 0x20);
  uStack_412 = (undefined1)((ulong)uVar5 >> 0x30);
  local_428 = (undefined1)uVar6;
  uStack_426 = (undefined1)((ulong)uVar6 >> 0x10);
  uStack_424 = (undefined1)((ulong)uVar6 >> 0x20);
  uStack_422 = (undefined1)((ulong)uVar6 >> 0x30);
  uStack_7c0 = CONCAT11(uStack_424,uStack_414);
  uStack_790 = CONCAT22(CONCAT11(uStack_406,uStack_3f6),CONCAT11(uStack_3e6,uStack_3d6));
  uVar6 = *(undefined8 *)((long)in_RSI + (long)(in_EDX * 2));
  uVar7 = *(undefined8 *)((long)in_RSI + (long)(in_EDX * 3));
  uStack_436 = (undefined1)((ulong)uVar6 >> 0x10);
  uStack_434 = (undefined1)((ulong)uVar6 >> 0x20);
  uStack_432 = (undefined1)((ulong)uVar6 >> 0x30);
  local_448 = (undefined1)uVar7;
  uStack_446 = (undefined1)((ulong)uVar7 >> 0x10);
  uStack_444 = (undefined1)((ulong)uVar7 >> 0x20);
  uStack_442 = (undefined1)((ulong)uVar7 >> 0x30);
  uStack_7d0 = CONCAT11(uStack_444,uStack_434);
  uVar7 = *(undefined8 *)((long)in_RSI + (long)(in_EDX << 2));
  uVar8 = *(undefined8 *)((long)in_RSI + (long)(in_EDX * 5));
  uStack_457 = (undefined1)((ulong)uVar7 >> 8);
  uStack_456 = (undefined1)((ulong)uVar7 >> 0x10);
  uStack_455 = (undefined1)((ulong)uVar7 >> 0x18);
  uStack_454 = (undefined1)((ulong)uVar7 >> 0x20);
  uStack_453 = (undefined1)((ulong)uVar7 >> 0x28);
  uStack_452 = (undefined1)((ulong)uVar7 >> 0x30);
  uStack_451 = (undefined1)((ulong)uVar7 >> 0x38);
  local_468 = (undefined1)uVar8;
  uStack_467 = (undefined1)((ulong)uVar8 >> 8);
  uStack_466 = (undefined1)((ulong)uVar8 >> 0x10);
  uStack_465 = (undefined1)((ulong)uVar8 >> 0x18);
  uStack_464 = (undefined1)((ulong)uVar8 >> 0x20);
  uStack_463 = (undefined1)((ulong)uVar8 >> 0x28);
  uStack_462 = (undefined1)((ulong)uVar8 >> 0x30);
  uStack_461 = (undefined1)((ulong)uVar8 >> 0x38);
  uVar9 = CONCAT11(local_468,(char)uVar7);
  uVar10 = CONCAT13(uStack_467,CONCAT12(uStack_457,uVar9));
  uVar11 = CONCAT15(uStack_466,CONCAT14(uStack_456,uVar10));
  uStack_7e0 = CONCAT11(uStack_464,uStack_454);
  _uStack_7e0 = CONCAT13(uStack_463,CONCAT12(uStack_453,uStack_7e0));
  _uStack_7e0 = CONCAT15(uStack_462,CONCAT14(uStack_452,_uStack_7e0));
  _uStack_7e0 = CONCAT17(uStack_461,CONCAT16(uStack_451,_uStack_7e0));
  uStack_800 = CONCAT22(CONCAT11(uStack_446,uStack_436),CONCAT11(uStack_426,uStack_416));
  uVar7 = *(undefined8 *)((long)in_RSI + (long)(in_EDX * 6));
  uVar8 = *(undefined8 *)((long)in_RSI + (long)(in_EDX * 7));
  uStack_477 = (undefined1)((ulong)uVar7 >> 8);
  uStack_476 = (undefined1)((ulong)uVar7 >> 0x10);
  uStack_475 = (undefined1)((ulong)uVar7 >> 0x18);
  uStack_474 = (undefined1)((ulong)uVar7 >> 0x20);
  uStack_473 = (undefined1)((ulong)uVar7 >> 0x28);
  uStack_472 = (undefined1)((ulong)uVar7 >> 0x30);
  uStack_471 = (undefined1)((ulong)uVar7 >> 0x38);
  local_488 = (undefined1)uVar8;
  uStack_487 = (undefined1)((ulong)uVar8 >> 8);
  uStack_486 = (undefined1)((ulong)uVar8 >> 0x10);
  uStack_485 = (undefined1)((ulong)uVar8 >> 0x18);
  uStack_484 = (undefined1)((ulong)uVar8 >> 0x20);
  uStack_483 = (undefined1)((ulong)uVar8 >> 0x28);
  uStack_482 = (undefined1)((ulong)uVar8 >> 0x30);
  uStack_481 = (undefined1)((ulong)uVar8 >> 0x38);
  uVar12 = CONCAT11(local_488,(char)uVar7);
  uVar13 = CONCAT13(uStack_487,CONCAT12(uStack_477,uVar12));
  uVar14 = CONCAT15(uStack_486,CONCAT14(uStack_476,uVar13));
  uStack_7f0 = CONCAT11(uStack_484,uStack_474);
  _uStack_7f0 = CONCAT13(uStack_483,CONCAT12(uStack_473,uStack_7f0));
  _uStack_7f0 = CONCAT15(uStack_482,CONCAT14(uStack_472,_uStack_7f0));
  _uStack_7f0 = CONCAT17(uStack_481,CONCAT16(uStack_471,_uStack_7f0));
  uStack_1f6 = (undefined2)((uint)uVar10 >> 0x10);
  uStack_1f4 = (undefined2)((uint6)uVar11 >> 0x20);
  uStack_1f2 = (undefined2)(CONCAT17(uStack_465,CONCAT16(uStack_455,uVar11)) >> 0x30);
  uStack_206 = (undefined2)((uint)uVar13 >> 0x10);
  uStack_204 = (undefined2)((uint6)uVar14 >> 0x20);
  uStack_202 = (undefined2)(CONCAT17(uStack_485,CONCAT16(uStack_475,uVar14)) >> 0x30);
  local_818 = CONCAT22(uVar12,uVar9);
  _local_818 = CONCAT24(uStack_1f6,local_818);
  _local_818 = CONCAT26(uStack_206,_local_818);
  uStack_810 = CONCAT22(uStack_204,uStack_1f4);
  _uStack_810 = CONCAT24(uStack_1f2,uStack_810);
  _uStack_810 = CONCAT26(uStack_202,_uStack_810);
  local_7b8 = CONCAT44(uStack_790,uStack_780);
  local_838 = CONCAT44(uStack_810,uStack_800);
  *in_RCX = CONCAT44(CONCAT22(CONCAT11(local_408,(char)uVar4),CONCAT11(local_3e8,(char)uVar3)),
                     CONCAT22(CONCAT11(local_3c8,(char)uVar2),CONCAT11(local_3a8,(char)uVar1)));
  in_RCX[1] = CONCAT44(local_818,
                       CONCAT22(CONCAT11(local_448,(char)uVar6),CONCAT11(local_428,(char)uVar5)));
  *(undefined8 *)((long)in_RCX + (long)in_R8D) = local_248;
  ((undefined8 *)((long)in_RCX + (long)in_R8D))[1] =
       CONCAT44((int)((ulong)_local_818 >> 0x20),uStack_120);
  puVar15 = (undefined8 *)((long)in_RCX + (long)(in_R8D * 2));
  *puVar15 = local_7b8;
  puVar15[1] = local_838;
  puVar15 = (undefined8 *)((long)in_RCX + (long)(in_R8D * 3));
  *puVar15 = local_288;
  puVar15[1] = CONCAT44((int)((ulong)_uStack_810 >> 0x20),uStack_140);
  local_788 = CONCAT22(uStack_750,uStack_740);
  uStack_780 = CONCAT22(CONCAT11(uStack_3c2,uStack_3b2),CONCAT11(uStack_3a2,uStack_392));
  local_798 = CONCAT22(uStack_770,uStack_760);
  uStack_790 = CONCAT22(CONCAT11(uStack_402,uStack_3f2),CONCAT11(uStack_3e2,uStack_3d2));
  local_808 = CONCAT22(uStack_7d0,uStack_7c0);
  uStack_800 = CONCAT22(CONCAT11(uStack_442,uStack_432),CONCAT11(uStack_422,uStack_412));
  x14[0]._2_2_ = (undefined2)((uint)_uStack_7e0 >> 0x10);
  x14[0]._4_2_ = (undefined2)((uint6)_uStack_7e0 >> 0x20);
  x14[0]._6_2_ = (undefined2)((ulong)_uStack_7e0 >> 0x30);
  x15[0]._2_2_ = (undefined2)((uint)_uStack_7f0 >> 0x10);
  x15[0]._4_2_ = (undefined2)((uint6)_uStack_7f0 >> 0x20);
  x15[0]._6_2_ = (undefined2)((ulong)_uStack_7f0 >> 0x30);
  local_818 = CONCAT22(uStack_7f0,uStack_7e0);
  _local_818 = CONCAT24(x14[0]._2_2_,local_818);
  _local_818 = CONCAT26(x15[0]._2_2_,_local_818);
  uStack_810 = CONCAT22(x15[0]._4_2_,x14[0]._4_2_);
  _uStack_810 = CONCAT24(x14[0]._6_2_,uStack_810);
  _uStack_810 = CONCAT26(x15[0]._6_2_,_uStack_810);
  local_7a8 = CONCAT44(local_798,local_788);
  local_7b8 = CONCAT44(uStack_790,uStack_780);
  local_828 = CONCAT44(local_818,local_808);
  local_838 = CONCAT44(uStack_810,uStack_800);
  puVar15 = (undefined8 *)((long)in_RCX + (long)(in_R8D << 2));
  *puVar15 = local_7a8;
  puVar15[1] = local_828;
  puVar15 = (undefined8 *)((long)in_RCX + (long)(in_R8D * 5));
  *puVar15 = local_2c8;
  puVar15[1] = CONCAT44((int)((ulong)_local_818 >> 0x20),uStack_160);
  puVar15 = (undefined8 *)((long)in_RCX + (long)(in_R8D * 6));
  *puVar15 = local_7b8;
  puVar15[1] = local_838;
  puVar15 = (undefined8 *)((long)in_RCX + (long)(in_R8D * 7));
  *puVar15 = local_308;
  puVar15[1] = CONCAT44((int)((ulong)_uStack_810 >> 0x20),uStack_180);
  return;
}

Assistant:

static inline void transpose_16x8(unsigned char *in0, unsigned char *in1,
                                  int in_p, unsigned char *out, int out_p) {
  __m128i x0, x1, x2, x3, x4, x5, x6, x7;
  __m128i x8, x9, x10, x11, x12, x13, x14, x15;

  x0 = _mm_loadl_epi64((__m128i *)in0);
  x1 = _mm_loadl_epi64((__m128i *)(in0 + in_p));
  x0 = _mm_unpacklo_epi8(x0, x1);

  x2 = _mm_loadl_epi64((__m128i *)(in0 + 2 * in_p));
  x3 = _mm_loadl_epi64((__m128i *)(in0 + 3 * in_p));
  x1 = _mm_unpacklo_epi8(x2, x3);

  x4 = _mm_loadl_epi64((__m128i *)(in0 + 4 * in_p));
  x5 = _mm_loadl_epi64((__m128i *)(in0 + 5 * in_p));
  x2 = _mm_unpacklo_epi8(x4, x5);

  x6 = _mm_loadl_epi64((__m128i *)(in0 + 6 * in_p));
  x7 = _mm_loadl_epi64((__m128i *)(in0 + 7 * in_p));
  x3 = _mm_unpacklo_epi8(x6, x7);
  x4 = _mm_unpacklo_epi16(x0, x1);

  x8 = _mm_loadl_epi64((__m128i *)in1);
  x9 = _mm_loadl_epi64((__m128i *)(in1 + in_p));
  x8 = _mm_unpacklo_epi8(x8, x9);
  x5 = _mm_unpacklo_epi16(x2, x3);

  x10 = _mm_loadl_epi64((__m128i *)(in1 + 2 * in_p));
  x11 = _mm_loadl_epi64((__m128i *)(in1 + 3 * in_p));
  x9 = _mm_unpacklo_epi8(x10, x11);

  x12 = _mm_loadl_epi64((__m128i *)(in1 + 4 * in_p));
  x13 = _mm_loadl_epi64((__m128i *)(in1 + 5 * in_p));
  x10 = _mm_unpacklo_epi8(x12, x13);
  x12 = _mm_unpacklo_epi16(x8, x9);

  x14 = _mm_loadl_epi64((__m128i *)(in1 + 6 * in_p));
  x15 = _mm_loadl_epi64((__m128i *)(in1 + 7 * in_p));
  x11 = _mm_unpacklo_epi8(x14, x15);
  x13 = _mm_unpacklo_epi16(x10, x11);

  x6 = _mm_unpacklo_epi32(x4, x5);
  x7 = _mm_unpackhi_epi32(x4, x5);
  x14 = _mm_unpacklo_epi32(x12, x13);
  x15 = _mm_unpackhi_epi32(x12, x13);

  // Store first 4-line result
  _mm_storeu_si128((__m128i *)out, _mm_unpacklo_epi64(x6, x14));
  _mm_storeu_si128((__m128i *)(out + out_p), _mm_unpackhi_epi64(x6, x14));
  _mm_storeu_si128((__m128i *)(out + 2 * out_p), _mm_unpacklo_epi64(x7, x15));
  _mm_storeu_si128((__m128i *)(out + 3 * out_p), _mm_unpackhi_epi64(x7, x15));

  x4 = _mm_unpackhi_epi16(x0, x1);
  x5 = _mm_unpackhi_epi16(x2, x3);
  x12 = _mm_unpackhi_epi16(x8, x9);
  x13 = _mm_unpackhi_epi16(x10, x11);

  x6 = _mm_unpacklo_epi32(x4, x5);
  x7 = _mm_unpackhi_epi32(x4, x5);
  x14 = _mm_unpacklo_epi32(x12, x13);
  x15 = _mm_unpackhi_epi32(x12, x13);

  // Store second 4-line result
  _mm_storeu_si128((__m128i *)(out + 4 * out_p), _mm_unpacklo_epi64(x6, x14));
  _mm_storeu_si128((__m128i *)(out + 5 * out_p), _mm_unpackhi_epi64(x6, x14));
  _mm_storeu_si128((__m128i *)(out + 6 * out_p), _mm_unpacklo_epi64(x7, x15));
  _mm_storeu_si128((__m128i *)(out + 7 * out_p), _mm_unpackhi_epi64(x7, x15));
}